

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O1

void __thiscall application::Message::Message(Message *this,wstring *user,wstring *content)

{
  pointer pwVar1;
  
  (this->user)._M_dataplus._M_p = (pointer)&(this->user).field_2;
  pwVar1 = (user->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)this,pwVar1,pwVar1 + user->_M_string_length);
  (this->content)._M_dataplus._M_p = (pointer)&(this->content).field_2;
  pwVar1 = (content->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->content,pwVar1,pwVar1 + content->_M_string_length);
  return;
}

Assistant:

Message(std::wstring user, std::wstring content)
			: user(user), content(content) {}